

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall
NavierStokesBase::calc_dsdt(NavierStokesBase *this,Real param_1,Real dt,MultiFab *dsdt)

{
  pointer pSVar1;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  MFIter mfi;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  if ((have_divu != 0) && (have_dsdt != 0)) {
    if (do_temp == 0) {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&dsdt->super_FabArray<amrex::FArrayBox>,0.0,0,
                 (dsdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
                 &(dsdt->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
      return;
    }
    pSVar1 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         pSVar1[Divu_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         pSVar1[Divu_Type].old_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::MFIter::MFIter(&local_90,(FabArrayBase *)dsdt,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        amrex::MFIter::tilebox(&local_16c,&local_90);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_d0,
                   (FabArray<amrex::FArrayBox> *)
                   this_00.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_110,
                   (FabArray<amrex::FArrayBox> *)
                   this_01.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_150,&dsdt->super_FabArray<amrex::FArrayBox>,&local_90);
        if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
          lVar6 = (long)local_16c.smallend.vect[1];
          lVar7 = (long)local_16c.smallend.vect[0];
          iVar3 = local_16c.smallend.vect[2];
          do {
            if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
              lVar8 = (long)iVar3;
              lVar4 = (long)local_150.p +
                      (lVar8 - local_150.begin.z) * local_150.kstride * 8 +
                      (lVar6 - local_150.begin.y) * local_150.jstride * 8 + lVar7 * 8 +
                      (long)local_150.begin.x * -8;
              lVar5 = (long)local_110.p +
                      (lVar8 - local_110.begin.z) * local_110.kstride * 8 +
                      (lVar6 - local_110.begin.y) * local_110.jstride * 8 + lVar7 * 8 +
                      (long)local_110.begin.x * -8;
              lVar9 = (long)local_d0.p +
                      (lVar8 - local_d0.begin.z) * local_d0.kstride * 8 +
                      (lVar6 - local_d0.begin.y) * local_d0.jstride * 8 + lVar7 * 8 +
                      (long)local_d0.begin.x * -8;
              lVar8 = lVar6;
              do {
                if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                  lVar2 = 0;
                  do {
                    *(double *)(lVar4 + lVar2 * 8) =
                         (*(double *)(lVar9 + lVar2 * 8) - *(double *)(lVar5 + lVar2 * 8)) / dt;
                    lVar2 = lVar2 + 1;
                  } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 != (int)lVar2
                          );
                }
                lVar8 = lVar8 + 1;
                lVar4 = lVar4 + local_150.jstride * 8;
                lVar5 = lVar5 + local_110.jstride * 8;
                lVar9 = lVar9 + local_d0.jstride * 8;
              } while (local_16c.bigend.vect[1] + 1 != (int)lVar8);
            }
            bVar10 = iVar3 != local_16c.bigend.vect[2];
            iVar3 = iVar3 + 1;
          } while (bVar10);
        }
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    amrex::MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
NavierStokesBase::calc_dsdt (Real      /*time*/,
                         Real      dt,
                         MultiFab& dsdt)
{
    if (have_divu && have_dsdt)
    {
        // Don't think we need this here. Instead, code will use FillPatch to
        // fill ghosts.
        //dsdt.setVal(0);

        if (do_temp) {
            MultiFab& Divu_new = get_new_data(Divu_Type);
            MultiFab& Divu_old = get_old_data(Divu_Type);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(dsdt,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box&  bx      = mfi.tilebox();
                auto const& div_new = Divu_new.array(mfi);
                auto const& div_old = Divu_old.array(mfi);
                auto const& dsdtarr = dsdt.array(mfi);

                amrex::ParallelFor(bx, [div_new, div_old, dsdtarr, dt]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    dsdtarr(i,j,k) = ( div_new(i,j,k) - div_old(i,j,k) )/ dt;
                });
            }
        }
        else
        {
            dsdt.setVal(0);
        }
    }
}